

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store
          (XMLWriter *this,Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *camera,ssize_t id
          )

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 *puVar3;
  pointer pRVar4;
  long *plVar5;
  ulong *puVar6;
  undefined8 uVar7;
  ulong uVar8;
  Ref<embree::SceneGraph::Node> local_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  undefined8 *local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 *local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"AnimatedPerspectiveCamera ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,
                              (ulong)(camera->ptr->super_PerspectiveCameraNode).super_Node.name.
                                     _M_dataplus._M_p);
  local_d0 = &local_c0;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_c0 = *plVar5;
    lStack_b8 = plVar2[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*plVar2;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_180 = *puVar6;
    lStack_178 = plVar2[3];
    local_190 = &local_180;
  }
  else {
    local_180 = *puVar6;
    local_190 = (ulong *)*plVar2;
  }
  local_188 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_f0,vsnprintf,0x3a,"%f",SUB84((double)(camera->ptr->time_range).lower,0));
  uVar8 = 0xf;
  if (local_190 != &local_180) {
    uVar8 = local_180;
  }
  if (uVar8 < local_f0._M_string_length + local_188) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar7 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_f0._M_string_length + local_188) goto LAB_0019dbc3;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_190);
  }
  else {
LAB_0019dbc3:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_f0._M_dataplus._M_p);
  }
  local_170 = &local_160;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_160 = *puVar1;
    uStack_158 = puVar3[3];
  }
  else {
    local_160 = *puVar1;
    local_170 = (undefined8 *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar6 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar6) {
    local_120 = *puVar6;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar6;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_110,vsnprintf,0x3a,"%f",SUB84((double)(camera->ptr->time_range).upper,0));
  uVar8 = 0xf;
  if (local_130 != &local_120) {
    uVar8 = local_120;
  }
  if (uVar8 < local_110._M_string_length + local_128) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar7 = local_110.field_2._M_allocated_capacity;
    }
    if (local_110._M_string_length + local_128 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_130);
      goto LAB_0019dd25;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
LAB_0019dd25:
  local_150 = &local_140;
  puVar1 = puVar3 + 2;
  if ((undefined8 *)*puVar3 == puVar1) {
    local_140 = *puVar1;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *puVar1;
    local_150 = (undefined8 *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = puVar1;
  puVar3[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = (undefined4)plVar2[3];
    uStack_74 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  open(this,(char *)&local_90,(int)local_88);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  pRVar4 = (camera->ptr->cameras).
           super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((camera->ptr->cameras).
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pRVar4) {
    uVar8 = 0;
    do {
      local_198.ptr = &(pRVar4[uVar8].ptr)->super_Node;
      if ((PerspectiveCameraNode *)local_198.ptr != (PerspectiveCameraNode *)0x0) {
        (*(((Node *)&(local_198.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[2])();
      }
      store(this,&local_198);
      if ((PerspectiveCameraNode *)local_198.ptr != (PerspectiveCameraNode *)0x0) {
        (*(((Node *)&(local_198.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
      }
      uVar8 = uVar8 + 1;
      pRVar4 = (camera->ptr->cameras).
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(camera->ptr->cameras).
                                   super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar4 >> 3));
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"AnimatedPerspectiveCamera","")
  ;
  close(this,(int)(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::AnimatedPerspectiveCameraNode> camera, ssize_t id)
  {
    open(std::string("AnimatedPerspectiveCamera ")+
         "name=\"" + camera->name + "\" "
         "time_range=\""+std::to_string(camera->time_range.lower)+" "+std::to_string(camera->time_range.upper)+"\"");
    
    for (size_t i=0; i<camera->size(); i++)
      store(camera->cameras[i].dynamicCast<SceneGraph::Node>());
    
    close("AnimatedPerspectiveCamera");
  }